

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void TElasticity3DAnalytic::ElasticDummy
               (TPZVec<double> *x,TPZVec<double> *result,TPZFMatrix<double> *deriv)

{
  int64_t iVar1;
  double *pdVar2;
  TPZManVector<double,_10> *this;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  STATE nu;
  STATE E;
  int i;
  TPZManVector<double,_10> xstate;
  size_t in_stack_00000328;
  char *in_stack_00000330;
  int64_t in_stack_ffffffffffffff28;
  double dVar3;
  TPZManVector<double,_10> *in_stack_ffffffffffffff30;
  int local_8c;
  TPZVec<double> local_88 [3];
  TPZVec<double> *local_10;
  TPZVec<double> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  TPZVec<double>::size(in_RDI);
  TPZManVector<double,_10>::TPZManVector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_8c = 0;
  while( true ) {
    iVar1 = TPZVec<double>::size(local_88);
    if (iVar1 <= local_8c) break;
    pdVar2 = TPZVec<double>::operator[](local_8,(long)local_8c);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_88,(long)local_8c);
    *pdVar2 = dVar3;
    local_8c = local_8c + 1;
  }
  pzinternal::DebugStopImpl(in_stack_00000330,in_stack_00000328);
  pdVar2 = TPZVec<double>::operator[](local_10,0);
  *pdVar2 = 1.0;
  this = (TPZManVector<double,_10> *)TPZVec<double>::operator[](local_10,1);
  (this->super_TPZVec<double>)._vptr_TPZVec = (_func_int **)0x3fd3333333333333;
  TPZManVector<double,_10>::~TPZManVector(this);
  return;
}

Assistant:

void TElasticity3DAnalytic::ElasticDummy(const TPZVec<REAL> &x, TPZVec<STATE> &result, TPZFMatrix<STATE> &deriv)
{
    TPZManVector<STATE> xstate(x.size());
    for (int i=0; i<xstate.size(); i++) {
        xstate[i] = x[i];
    }
    STATE E = 1.,nu = 0.3;
    DebugStop();
//    Elastic(xstate,E,nu);
    result[0] = E;
    result[1] = nu;
}